

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl_bio.c
# Opt level: O1

int amqp_openssl_bio_read(BIO *b,char *out,int outl)

{
  int iVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  int res;
  int fd;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  BIO_ctrl((BIO *)b,0x69,0,&local_24);
  sVar2 = recv(local_24,out,(long)outl,0x4000);
  BIO_clear_flags((BIO *)b,0xf);
  res = (int)sVar2;
  if (res < 1) {
    iVar1 = amqp_openssl_bio_should_retry(res);
    if (iVar1 != 0) {
      BIO_set_flags((BIO *)b,9);
    }
  }
  return res;
}

Assistant:

static int amqp_openssl_bio_read(BIO *b, char *out, int outl) {
  int flags = 0;
  int fd;
  int res;

#ifdef MSG_NOSIGNAL
  flags |= MSG_NOSIGNAL;
#endif

  BIO_get_fd(b, &fd);
  res = recv(fd, out, outl, flags);

  BIO_clear_retry_flags(b);
  if (res <= 0 && amqp_openssl_bio_should_retry(res)) {
    BIO_set_retry_read(b);
  }

  return res;
}